

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

int Abc_CommandAbc9Retime(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint nMaxIters;
  Gia_Man_t *pGVar2;
  char *pcVar3;
  uint fVerbose;
  int iVar4;
  
  fVerbose = 0;
  Extra_UtilGetoptReset();
  nMaxIters = 100;
  while( true ) {
    while (iVar1 = Extra_UtilGetopt(argc,argv,"Nvh"), iVar4 = globalUtilOptind, iVar1 == 0x76) {
      fVerbose = fVerbose ^ 1;
    }
    if (iVar1 == -1) {
      pGVar2 = pAbc->pGia;
      if (pGVar2 != (Gia_Man_t *)0x0) {
        if (pGVar2->nRegs != 0) {
          pGVar2 = Gia_ManRetimeForward(pGVar2,nMaxIters,fVerbose);
          Abc_FrameUpdateGia(pAbc,pGVar2);
          return 0;
        }
        Abc_Print(-1,"The network is combinational.\n");
        return 0;
      }
      pcVar3 = "Abc_CommandAbc9Retime(): There is no AIG.\n";
      iVar4 = -1;
      goto LAB_0027c6f8;
    }
    if (iVar1 != 0x4e) goto LAB_0027c68a;
    if (argc <= globalUtilOptind) break;
    nMaxIters = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar4 + 1;
    if ((int)nMaxIters < 0) {
LAB_0027c68a:
      Abc_Print(-2,"usage: &retime [-N <num>] [-vh]\n");
      Abc_Print(-2,"\t         performs most-forward retiming\n");
      Abc_Print(-2,"\t-N num : the number of incremental iterations [default = %d]\n",
                (ulong)nMaxIters);
      pcVar3 = "yes";
      if (fVerbose == 0) {
        pcVar3 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar3);
      pcVar3 = "\t-h     : print the command usage\n";
      iVar4 = -2;
LAB_0027c6f8:
      Abc_Print(iVar4,pcVar3);
      return 1;
    }
  }
  Abc_Print(-1,"Command line switch \"-N\" should be followed by an integer.\n");
  goto LAB_0027c68a;
}

Assistant:

int Abc_CommandAbc9Retime( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Gia_Man_t * pTemp;
    int c;
    int nMaxIters = 100;
    int fVerbose  =   0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Nvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by an integer.\n" );
                goto usage;
            }
            nMaxIters = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nMaxIters < 0 )
                goto usage;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Retime(): There is no AIG.\n" );
        return 1;
    }
    if ( Gia_ManRegNum(pAbc->pGia) == 0 )
    {
        Abc_Print( -1, "The network is combinational.\n" );
        return 0;
    }
    pTemp = Gia_ManRetimeForward( pAbc->pGia, nMaxIters, fVerbose );
    Abc_FrameUpdateGia( pAbc, pTemp );
    return 0;

usage:
    Abc_Print( -2, "usage: &retime [-N <num>] [-vh]\n" );
    Abc_Print( -2, "\t         performs most-forward retiming\n" );
    Abc_Print( -2, "\t-N num : the number of incremental iterations [default = %d]\n", nMaxIters );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}